

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_datagram_socket.hpp
# Opt level: O2

size_t __thiscall
asio::basic_datagram_socket<asio::ip::udp,_asio::any_io_executor>::send_to<asio::const_buffers_1>
          (basic_datagram_socket<asio::ip::udp,_asio::any_io_executor> *this,
          const_buffers_1 *buffers,endpoint_type *destination)

{
  size_t sVar1;
  error_code ec;
  error_code local_30;
  
  local_30._M_value = 0;
  local_30._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = asio::detail::reactive_socket_service<asio::ip::udp>::send_to<asio::const_buffers_1>
                    ((this->super_basic_socket<asio::ip::udp,_asio::any_io_executor>).impl_.service_
                     ,&(this->super_basic_socket<asio::ip::udp,_asio::any_io_executor>).impl_.
                       implementation_,buffers,destination,0,&local_30);
  asio::detail::throw_error(&local_30,"send_to");
  return sVar1;
}

Assistant:

std::size_t send_to(const ConstBufferSequence& buffers,
      const endpoint_type& destination)
  {
    asio::error_code ec;
    std::size_t s = this->impl_.get_service().send_to(
        this->impl_.get_implementation(), buffers, destination, 0, ec);
    asio::detail::throw_error(ec, "send_to");
    return s;
  }